

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall FGameConfigFile::DoGameSetup(FGameConfigFile *this,char *gamename)

{
  bool bVar1;
  int iVar2;
  char *local_30;
  char *name;
  char *value;
  char *key;
  char *gamename_local;
  FGameConfigFile *this_local;
  
  key = gamename;
  gamename_local = (char *)this;
  iVar2 = mysnprintf(this->section,0x40,"%s.",gamename);
  this->sublen = 0x3f - (long)iVar2;
  this->subsection = (char *)((long)this + (0x78 - this->sublen));
  this->section[0x3f] = '\0';
  strncpy(this->subsection,"UnknownConsoleVariables",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
  if (bVar1) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"ConsoleVariables",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
  if (bVar1) {
    ReadCVars(this,0);
  }
  if ((gameinfo.gametype & GAME_Raven) != GAME_Any) {
    SetRavenDefaults(this,gameinfo.gametype == GAME_Hexen);
  }
  strncpy(this->subsection,"LocalServerInfo",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
  if (bVar1) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"Player",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
  if (bVar1) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"ConsoleAliases",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,this->section,false);
  if (bVar1) {
    local_30 = (char *)0x0;
    while (bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&value,&name), bVar1) {
      iVar2 = strcasecmp(value,"Name");
      if (iVar2 == 0) {
        local_30 = name;
      }
      else {
        iVar2 = strcasecmp(value,"Command");
        if ((iVar2 == 0) && (local_30 != (char *)0x0)) {
          C_SetAlias(local_30,name);
          local_30 = (char *)0x0;
        }
      }
    }
  }
  (this->super_FConfigFile).OkayToWrite = true;
  return;
}

Assistant:

void FGameConfigFile::DoGameSetup (const char *gamename)
{
	const char *key;
	const char *value;

	sublen = countof(section) - 1 - mysnprintf (section, countof(section), "%s.", gamename);
	subsection = section + countof(section) - sublen - 1;
	section[countof(section) - 1] = '\0';
	
	strncpy (subsection, "UnknownConsoleVariables", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "ConsoleVariables", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	if (gameinfo.gametype & GAME_Raven)
	{
		SetRavenDefaults (gameinfo.gametype == GAME_Hexen);
	}

	// The NetServerInfo section will be read and override anything loaded
	// here when it's determined that a netgame is being played.
	strncpy (subsection, "LocalServerInfo", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "Player", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "ConsoleAliases", sublen);
	if (SetSection (section))
	{
		const char *name = NULL;
		while (NextInSection (key, value))
		{
			if (stricmp (key, "Name") == 0)
			{
				name = value;
			}
			else if (stricmp (key, "Command") == 0 && name != NULL)
			{
				C_SetAlias (name, value);
				name = NULL;
			}
		}
	}
	OkayToWrite = true;
}